

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall Json::OurReader::readToken(OurReader *this,Token *token)

{
  char cVar1;
  char *pcVar2;
  int patternLength;
  bool bVar3;
  bool bVar4;
  Char *pattern;
  
  skipSpaces(this);
  pcVar2 = this->current_;
  token->start_ = pcVar2;
  if (pcVar2 == this->end_) {
LAB_006fa036:
    token->type_ = tokenEndOfStream;
    goto LAB_006fa039;
  }
  this->current_ = pcVar2 + 1;
  cVar1 = *pcVar2;
  switch(cVar1) {
  case '\"':
    token->type_ = tokenString;
    bVar4 = readString(this);
    goto LAB_006fa19d;
  case '#':
  case '$':
  case '%':
  case '&':
  case '(':
  case ')':
  case '*':
  case '.':
  case ';':
  case '<':
  case '=':
  case '>':
  case '?':
  case '@':
  case 'A':
  case 'B':
  case 'C':
  case 'D':
  case 'E':
  case 'F':
  case 'G':
  case 'H':
  case 'J':
  case 'K':
  case 'L':
  case 'M':
    break;
  case '\'':
    if ((this->features_).allowSingleQuotes_ == true) {
      token->type_ = tokenString;
      bVar4 = readStringSingleQuote(this);
      goto LAB_006fa19d;
    }
    break;
  case '+':
    bVar4 = readNumber(this,true);
    if (bVar4) {
LAB_006fa11e:
      token->type_ = tokenNumber;
      goto LAB_006fa039;
    }
    token->type_ = tokenPosInf;
    if ((this->features_).allowSpecialFloats_ != false) goto LAB_006fa18b;
    break;
  case ',':
    token->type_ = tokenArraySeparator;
    goto LAB_006fa039;
  case '-':
    bVar4 = readNumber(this,true);
    if (bVar4) goto LAB_006fa11e;
    token->type_ = tokenNegInf;
    if ((this->features_).allowSpecialFloats_ == true) goto LAB_006fa18b;
    break;
  case '/':
    token->type_ = tokenComment;
    bVar4 = readComment(this);
LAB_006fa19d:
    bVar3 = true;
    if (bVar4 != false) goto LAB_006fa03b;
    break;
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    token->type_ = tokenNumber;
    readNumber(this,false);
    goto LAB_006fa039;
  case ':':
    token->type_ = tokenMemberSeparator;
    goto LAB_006fa039;
  case 'I':
    if ((this->features_).allowSpecialFloats_ == true) {
      token->type_ = tokenPosInf;
LAB_006fa18b:
      pattern = "nfinity";
      patternLength = 7;
LAB_006fa194:
      bVar4 = match(this,pattern,patternLength);
      goto LAB_006fa19d;
    }
    break;
  case 'N':
    if ((this->features_).allowSpecialFloats_ == true) {
      token->type_ = tokenNaN;
      pattern = "aN";
      patternLength = 2;
      goto LAB_006fa194;
    }
    break;
  default:
    if (cVar1 == '\0') goto LAB_006fa036;
    if (cVar1 == '[') {
      token->type_ = tokenArrayBegin;
    }
    else {
      if (cVar1 != ']') {
        if (cVar1 == 'f') {
          token->type_ = tokenFalse;
          pattern = "alse";
          patternLength = 4;
          goto LAB_006fa194;
        }
        if (cVar1 == 'n') {
          token->type_ = tokenNull;
          pattern = "ull";
        }
        else {
          if (cVar1 != 't') {
            if (cVar1 == '}') {
              token->type_ = tokenObjectEnd;
            }
            else {
              if (cVar1 != '{') break;
              token->type_ = tokenObjectBegin;
            }
            goto LAB_006fa039;
          }
          token->type_ = tokenTrue;
          pattern = "rue";
        }
        patternLength = 3;
        goto LAB_006fa194;
      }
      token->type_ = tokenArrayEnd;
    }
LAB_006fa039:
    bVar3 = true;
    goto LAB_006fa03b;
  }
  token->type_ = tokenError;
  bVar3 = false;
LAB_006fa03b:
  token->end_ = this->current_;
  return bVar3;
}

Assistant:

bool OurReader::readToken(Token& token) {
  skipSpaces();
  token.start_ = current_;
  Char c = getNextChar();
  bool ok = true;
  switch (c) {
  case '{':
    token.type_ = tokenObjectBegin;
    break;
  case '}':
    token.type_ = tokenObjectEnd;
    break;
  case '[':
    token.type_ = tokenArrayBegin;
    break;
  case ']':
    token.type_ = tokenArrayEnd;
    break;
  case '"':
    token.type_ = tokenString;
    ok = readString();
    break;
  case '\'':
    if (features_.allowSingleQuotes_) {
      token.type_ = tokenString;
      ok = readStringSingleQuote();
    } else {
      // If we don't allow single quotes, this is a failure case.
      ok = false;
    }
    break;
  case '/':
    token.type_ = tokenComment;
    ok = readComment();
    break;
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    token.type_ = tokenNumber;
    readNumber(false);
    break;
  case '-':
    if (readNumber(true)) {
      token.type_ = tokenNumber;
    } else {
      token.type_ = tokenNegInf;
      ok = features_.allowSpecialFloats_ && match("nfinity", 7);
    }
    break;
  case '+':
    if (readNumber(true)) {
      token.type_ = tokenNumber;
    } else {
      token.type_ = tokenPosInf;
      ok = features_.allowSpecialFloats_ && match("nfinity", 7);
    }
    break;
  case 't':
    token.type_ = tokenTrue;
    ok = match("rue", 3);
    break;
  case 'f':
    token.type_ = tokenFalse;
    ok = match("alse", 4);
    break;
  case 'n':
    token.type_ = tokenNull;
    ok = match("ull", 3);
    break;
  case 'N':
    if (features_.allowSpecialFloats_) {
      token.type_ = tokenNaN;
      ok = match("aN", 2);
    } else {
      ok = false;
    }
    break;
  case 'I':
    if (features_.allowSpecialFloats_) {
      token.type_ = tokenPosInf;
      ok = match("nfinity", 7);
    } else {
      ok = false;
    }
    break;
  case ',':
    token.type_ = tokenArraySeparator;
    break;
  case ':':
    token.type_ = tokenMemberSeparator;
    break;
  case 0:
    token.type_ = tokenEndOfStream;
    break;
  default:
    ok = false;
    break;
  }
  if (!ok)
    token.type_ = tokenError;
  token.end_ = current_;
  return ok;
}